

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Benchmark.cpp
# Opt level: O2

double __thiscall anon_unknown.dwarf_266b9::StopWatch::operator()(StopWatch *this,Times type)

{
  long lVar1;
  
  lVar1 = std::chrono::_V2::system_clock::now();
  return (double)(lVar1 - (this->tp_).__d.__r) / *(double *)(&DAT_0012e060 + (long)(int)type * 8);
}

Assistant:

double operator()(Times type) const {
    auto tp = std::chrono::high_resolution_clock::now() - tp_;
    double ret;

    switch (type) {
      case Times::sec:
        ret = std::chrono::duration<double>(tp).count();
        break;
      case Times::milli:
        ret = std::chrono::duration<double, std::milli>(tp).count();
        break;
      case Times::micro:
        ret = std::chrono::duration<double, std::micro>(tp).count();
        break;
    }

    return ret;
  }